

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int __kmp_api_omp_get_num_devices_(void)

{
  code *pcVar1;
  _func_int *fptr;
  int local_4;
  
  pcVar1 = (code *)dlsym(0,"_Offload_number_of_devices");
  if (pcVar1 == (code *)0x0) {
    pcVar1 = (code *)dlsym(0xffffffffffffffff,"omp_get_num_devices");
    if (pcVar1 == (code *)0x0) {
      local_4 = 0;
    }
    else {
      local_4 = (*pcVar1)();
    }
  }
  else {
    local_4 = (*pcVar1)();
  }
  return local_4;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_NUM_DEVICES)(void) {
#if KMP_MIC || KMP_OS_DARWIN || KMP_OS_WINDOWS || defined(KMP_STUB)
  return 0;
#else
  int (*fptr)();
  if ((*(void **)(&fptr) = dlsym(RTLD_DEFAULT, "_Offload_number_of_devices"))) {
    return (*fptr)();
  } else if ((*(void **)(&fptr) = dlsym(RTLD_NEXT, "omp_get_num_devices"))) {
    return (*fptr)();
  } else { // liboffload & libomptarget don't exist
    return 0;
  }
#endif // KMP_MIC || KMP_OS_DARWIN || KMP_OS_WINDOWS || defined(KMP_STUB)
}